

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_resource_manager.cpp
# Opt level: O1

bool __thiscall
CS248::GLResourceManager::createVertexShader
          (GLResourceManager *this,char *source_code,ShaderId *out_sid)

{
  bool bVar1;
  
  bVar1 = anon_unknown_10::createShaderOfType(source_code,0x8b31,out_sid);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Above Errors are for vertex shader",0x22);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
  }
  return bVar1;
}

Assistant:

bool GLResourceManager::createVertexShader(const char* source_code, ShaderId* out_sid) {
  bool success = createShaderOfType(source_code, GL_VERTEX_SHADER, out_sid);
  if (!success) {
    cerr << "Above Errors are for vertex shader" << endl;
  }
  return success;
}